

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

double calculate_modified_err_new
                 (FRAME_INFO *frame_info,FIRSTPASS_STATS *total_stats,FIRSTPASS_STATS *this_stats,
                 int vbrbias,double modified_error_min,double modified_error_max)

{
  int in_ECX;
  long in_RDX;
  long in_RSI;
  double in_XMM0_Qa;
  FRAME_INFO *frame_info_00;
  FIRSTPASS_STATS *this_frame;
  double dVar1;
  double dVar2;
  double in_XMM1_Qa;
  double modified_error;
  double av_err;
  double av_weight;
  undefined8 local_8;
  
  if (in_RSI == 0) {
    local_8 = 0.0;
  }
  else {
    frame_info_00 =
         (FRAME_INFO *)
         ((*(double *)(in_RSI + 0x20) * (*(double *)(in_RSI + 8) / *(double *)(in_RSI + 0xb0))) /
         *(double *)(in_RSI + 0xb0));
    if (0.0 <= (double)frame_info_00) {
      this_frame = (FIRSTPASS_STATS *)((double)frame_info_00 + 1e-06);
    }
    else {
      this_frame = (FIRSTPASS_STATS *)((double)frame_info_00 - 1e-06);
    }
    dVar1 = pow((*(double *)(in_RDX + 0x20) * *(double *)(in_RDX + 8)) / (double)this_frame,
                (double)in_ECX / 100.0);
    dVar2 = calculate_active_area(frame_info_00,this_frame);
    dVar2 = pow(dVar2,0.5);
    local_8 = fclamp(dVar2 * (double)frame_info_00 * dVar1,in_XMM0_Qa,in_XMM1_Qa);
  }
  return local_8;
}

Assistant:

static double calculate_modified_err_new(const FRAME_INFO *frame_info,
                                         const FIRSTPASS_STATS *total_stats,
                                         const FIRSTPASS_STATS *this_stats,
                                         int vbrbias, double modified_error_min,
                                         double modified_error_max) {
  if (total_stats == NULL) {
    return 0;
  }
  const double av_weight = total_stats->weight / total_stats->count;
  const double av_err =
      (total_stats->coded_error * av_weight) / total_stats->count;
  double modified_error =
      av_err * pow(this_stats->coded_error * this_stats->weight /
                       DOUBLE_DIVIDE_CHECK(av_err),
                   vbrbias / 100.0);

  // Correction for active area. Frames with a reduced active area
  // (eg due to formatting bars) have a higher error per mb for the
  // remaining active MBs. The correction here assumes that coding
  // 0.5N blocks of complexity 2X is a little easier than coding N
  // blocks of complexity X.
  modified_error *=
      pow(calculate_active_area(frame_info, this_stats), ACT_AREA_CORRECTION);

  return fclamp(modified_error, modified_error_min, modified_error_max);
}